

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O2

void __thiscall curlpp::LibcurlRuntimeError::~LibcurlRuntimeError(LibcurlRuntimeError *this)

{
  std::runtime_error::~runtime_error((runtime_error *)this);
  operator_delete(this);
  return;
}

Assistant:

class CURLPPAPI LibcurlRuntimeError : public curlpp::RuntimeError
	{

	public:

		LibcurlRuntimeError(const std::string & reason, CURLcode code);
		LibcurlRuntimeError(const char * reason, CURLcode code);

		/**
		* Returns the CURLcode that libcurl returned.
		*/
		CURLcode whatCode() const throw();

	private:

		CURLcode mCode;

	}